

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

void __thiscall
Fossilize::StateRecorder::Impl::register_module_identifier
          (Impl *this,VkShaderModule module,
          VkPipelineShaderStageModuleIdentifierCreateInfoEXT *ident)

{
  DatabaseInterface *pDVar1;
  int iVar2;
  mapped_type *ppVVar3;
  VkShaderModuleIdentifierEXT m;
  key_type local_58;
  
  if ((this->record_data).write_database_entries == true) {
    pDVar1 = this->module_identifier_database_iface;
    if (((pDVar1 != (DatabaseInterface *)0x0) && (ident->identifierSize != 0)) &&
       (iVar2 = (*pDVar1->_vptr_DatabaseInterface[5])(pDVar1,4,module), (char)iVar2 == '\0')) {
      (*this->module_identifier_database_iface->_vptr_DatabaseInterface[4])
                (this->module_identifier_database_iface,4,module,ident->pIdentifier,
                 (ulong)ident->identifierSize,8);
      local_58.pNext = (void *)0x0;
      local_58.identifier[0xc] = '\0';
      local_58.identifier[0xd] = '\0';
      local_58.identifier[0xe] = '\0';
      local_58.identifier[0xf] = '\0';
      local_58.identifier[0x10] = '\0';
      local_58.identifier[0x11] = '\0';
      local_58.identifier[0x12] = '\0';
      local_58.identifier[0x13] = '\0';
      local_58.identifier[0x14] = '\0';
      local_58.identifier[0x15] = '\0';
      local_58.identifier[0x16] = '\0';
      local_58.identifier[0x17] = '\0';
      local_58.identifier[0x18] = '\0';
      local_58.identifier[0x19] = '\0';
      local_58.identifier[0x1a] = '\0';
      local_58.identifier[0x1b] = '\0';
      local_58.identifier[4] = '\0';
      local_58.identifier[5] = '\0';
      local_58.identifier[6] = '\0';
      local_58.identifier[7] = '\0';
      local_58.identifier[8] = '\0';
      local_58.identifier[9] = '\0';
      local_58.identifier[10] = '\0';
      local_58.identifier[0xb] = '\0';
      local_58.identifier[0x1c] = '\0';
      local_58.identifier[0x1d] = '\0';
      local_58.identifier[0x1e] = '\0';
      local_58.identifier[0x1f] = '\0';
      local_58._52_4_ = 0;
      local_58.sType = VK_STRUCTURE_TYPE_SHADER_MODULE_IDENTIFIER_EXT;
      local_58._4_4_ = 0;
      local_58.identifier._0_4_ = 0;
      local_58.identifierSize = ident->identifierSize;
      memcpy(local_58.identifier,ident->pIdentifier,(ulong)ident->identifierSize);
      ppVVar3 = std::__detail::
                _Map_base<VkShaderModuleIdentifierEXT,_std::pair<const_VkShaderModuleIdentifierEXT,_VkShaderModule_T_*>,_std::allocator<std::pair<const_VkShaderModuleIdentifierEXT,_VkShaderModule_T_*>_>,_std::__detail::_Select1st,_std::equal_to<VkShaderModuleIdentifierEXT>,_std::hash<VkShaderModuleIdentifierEXT>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<VkShaderModuleIdentifierEXT,_std::pair<const_VkShaderModuleIdentifierEXT,_VkShaderModule_T_*>,_std::allocator<std::pair<const_VkShaderModuleIdentifierEXT,_VkShaderModule_T_*>_>,_std::__detail::_Select1st,_std::equal_to<VkShaderModuleIdentifierEXT>,_std::hash<VkShaderModuleIdentifierEXT>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&this->identifier_to_module,&local_58);
      *ppVVar3 = module;
    }
  }
  return;
}

Assistant:

void StateRecorder::Impl::register_module_identifier(
		VkShaderModule module, const VkPipelineShaderStageModuleIdentifierCreateInfoEXT &ident)
{
	auto hash = (uint64_t)module;
	if (record_data.write_database_entries &&
	    module_identifier_database_iface &&
	    ident.identifierSize && !module_identifier_database_iface->has_entry(RESOURCE_SHADER_MODULE, hash))
	{
		module_identifier_database_iface->write_entry(
				RESOURCE_SHADER_MODULE, hash, ident.pIdentifier, ident.identifierSize,
				PAYLOAD_WRITE_COMPUTE_CHECKSUM_BIT);

		VkShaderModuleIdentifierEXT m = { VK_STRUCTURE_TYPE_SHADER_MODULE_IDENTIFIER_EXT };
		m.identifierSize = ident.identifierSize;
		memcpy(m.identifier, ident.pIdentifier, ident.identifierSize);
		identifier_to_module[m] = module;
	}
}